

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O0

opj_pi_iterator_t *
pi_initialise_encode(opj_image_t *image,opj_cp_t *cp,int tileno,J2K_T2_MODE t2_mode)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int a;
  int iVar6;
  int a_00;
  int a_01;
  int a_02;
  int a_03;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  opj_pi_comp_t *poVar12;
  uint *puVar13;
  opj_pi_resolution_t *poVar14;
  short *psVar15;
  int in_ECX;
  int in_EDX;
  int *in_RSI;
  int *in_RDI;
  opj_pi_resolution_t *res_1;
  int dy;
  int dx;
  opj_pi_comp_t *comp_1;
  opj_pi_resolution_t *res;
  int py1;
  int px1;
  int py0;
  int px0;
  int ry1;
  int rx1;
  int ry0;
  int rx0;
  int levelno;
  opj_pi_comp_t *comp;
  int tcy1;
  int tcx1;
  int tcy0;
  int tcx0;
  opj_tccp_t *tccp;
  opj_tcp_t *tcp;
  opj_pi_iterator_t *pi;
  int maxprec;
  int maxres;
  int resno;
  int compno;
  int pino;
  int q;
  int p;
  undefined4 local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int in_stack_ffffffffffffff44;
  opj_cp_t *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  opj_pi_iterator_t *local_8;
  
  local_38 = 0;
  local_3c = 0;
  lVar11 = *(long *)(in_RSI + 0x20) + (long)in_EDX * 0x15e8;
  local_8 = (opj_pi_iterator_t *)calloc((long)(*(int *)(lVar11 + 0x1a4) + 1),0xf8);
  if (local_8 == (opj_pi_iterator_t *)0x0) {
    local_8 = (opj_pi_iterator_t *)0x0;
  }
  else {
    local_8->tp_on = (char)in_RSI[4];
    for (local_2c = 0; local_2c < *(int *)(lVar11 + 0x1a4) + 1; local_2c = local_2c + 1) {
      iVar4 = in_RSI[0x12];
      iVar5 = in_RSI[0x12];
      iVar3 = int_max(in_RSI[0xc] + (in_EDX % iVar4) * in_RSI[0xe],*in_RDI);
      local_8[local_2c].tx0 = iVar3;
      iVar3 = int_max(in_RSI[0xd] + (in_EDX / iVar5) * in_RSI[0xf],in_RDI[1]);
      local_8[local_2c].ty0 = iVar3;
      iVar4 = int_min(in_RSI[0xc] + (in_EDX % iVar4 + 1) * in_RSI[0xe],in_RDI[2]);
      local_8[local_2c].tx1 = iVar4;
      iVar4 = int_min(in_RSI[0xd] + (in_EDX / iVar5 + 1) * in_RSI[0xf],in_RDI[3]);
      local_8[local_2c].ty1 = iVar4;
      local_8[local_2c].numcomps = in_RDI[4];
      poVar12 = (opj_pi_comp_t *)calloc((ulong)(uint)in_RDI[4],0x18);
      local_8[local_2c].comps = poVar12;
      if (local_8[local_2c].comps == (opj_pi_comp_t *)0x0) {
        pi_destroy((opj_pi_iterator_t *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
        return (opj_pi_iterator_t *)0x0;
      }
      for (local_30 = 0; local_30 < local_8[local_2c].numcomps; local_30 = local_30 + 1) {
        poVar12 = local_8[local_2c].comps + local_30;
        puVar13 = (uint *)(*(long *)(lVar11 + 0x15e0) + (long)local_30 * 0x438);
        poVar12->dx = *(int *)(*(long *)(in_RDI + 6) + (long)local_30 * 0x38);
        poVar12->dy = *(int *)(*(long *)(in_RDI + 6) + (long)local_30 * 0x38 + 4);
        poVar12->numresolutions = puVar13[1];
        poVar14 = (opj_pi_resolution_t *)malloc((long)poVar12->numresolutions << 4);
        poVar12->resolutions = poVar14;
        if (poVar12->resolutions == (opj_pi_resolution_t *)0x0) {
          pi_destroy((opj_pi_iterator_t *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
          return (opj_pi_iterator_t *)0x0;
        }
        iVar4 = int_ceildiv(local_8[local_2c].tx0,poVar12->dx);
        iVar5 = int_ceildiv(local_8[local_2c].ty0,poVar12->dy);
        iVar3 = int_ceildiv(local_8[local_2c].tx1,poVar12->dx);
        a = int_ceildiv(local_8[local_2c].ty1,poVar12->dy);
        if (local_38 < poVar12->numresolutions) {
          local_38 = poVar12->numresolutions;
        }
        for (local_34 = 0; local_34 < poVar12->numresolutions; local_34 = local_34 + 1) {
          poVar14 = poVar12->resolutions + local_34;
          if ((*puVar13 & 1) == 0) {
            poVar14->pdx = 0xf;
            poVar14->pdy = 0xf;
          }
          else {
            poVar14->pdx = puVar13[(long)local_34 + 0xcb];
            poVar14->pdy = puVar13[(long)local_34 + 0xec];
          }
          iVar6 = (poVar12->numresolutions + -1) - local_34;
          a_00 = int_ceildivpow2(iVar4,iVar6);
          a_01 = int_ceildivpow2(iVar5,iVar6);
          a_02 = int_ceildivpow2(iVar3,iVar6);
          a_03 = int_ceildivpow2(a,iVar6);
          iVar7 = int_floordivpow2(a_00,poVar14->pdx);
          iVar6 = poVar14->pdx;
          iVar8 = int_floordivpow2(a_01,poVar14->pdy);
          iVar1 = poVar14->pdy;
          iVar9 = int_ceildivpow2(a_02,poVar14->pdx);
          iVar2 = poVar14->pdx;
          iVar10 = int_ceildivpow2(a_03,poVar14->pdy);
          if (a_00 == a_02) {
            in_stack_ffffffffffffff44 = 0;
          }
          else {
            in_stack_ffffffffffffff44 =
                 (iVar9 << ((byte)iVar2 & 0x1f)) - (iVar7 << ((byte)iVar6 & 0x1f)) >>
                 ((byte)poVar14->pdx & 0x1f);
          }
          poVar14->pw = in_stack_ffffffffffffff44;
          if (a_01 == a_03) {
            local_c0 = 0;
          }
          else {
            local_c0 = (iVar10 << ((byte)poVar14->pdy & 0x1f)) - (iVar8 << ((byte)iVar1 & 0x1f)) >>
                       ((byte)poVar14->pdy & 0x1f);
          }
          poVar14->ph = local_c0;
          if (local_3c < poVar14->pw * poVar14->ph) {
            local_3c = poVar14->pw * poVar14->ph;
          }
        }
      }
      local_8[local_2c].step_p = 1;
      local_8[local_2c].step_c = local_3c * local_8[local_2c].step_p;
      local_8[local_2c].step_r = in_RDI[4] * local_8[local_2c].step_c;
      local_8[local_2c].step_l = local_38 * local_8[local_2c].step_r;
      for (local_30 = 0; local_30 < local_8->numcomps; local_30 = local_30 + 1) {
        poVar12 = local_8->comps + local_30;
        for (local_34 = 0; local_34 < poVar12->numresolutions; local_34 = local_34 + 1) {
          in_stack_ffffffffffffff48 = (opj_cp_t *)(poVar12->resolutions + local_34);
          local_c4 = poVar12->dx *
                     (1 << (((char)in_stack_ffffffffffffff48->cinema + (char)poVar12->numresolutions
                            + -1) - (char)local_34 & 0x1fU));
          local_c8 = poVar12->dy *
                     (1 << (((char)in_stack_ffffffffffffff48->max_comp_size +
                             (char)poVar12->numresolutions + -1) - (char)local_34 & 0x1fU));
          in_stack_ffffffffffffff54 = local_c4;
          if (local_8->dx != 0) {
            local_c4 = int_min(local_8->dx,local_c4);
          }
          local_8[local_2c].dx = local_c4;
          in_stack_ffffffffffffff50 = local_c8;
          if (local_8->dy != 0) {
            local_c8 = int_min(local_8->dy,local_c8);
          }
          local_8[local_2c].dy = local_c8;
        }
      }
      if (local_2c == 0) {
        psVar15 = (short *)calloc((long)(*(int *)(lVar11 + 0xc) * local_8->step_l),2);
        local_8->include = psVar15;
        if (local_8->include == (short *)0x0) {
          pi_destroy((opj_pi_iterator_t *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
          return (opj_pi_iterator_t *)0x0;
        }
      }
      else {
        local_8[local_2c].include = local_8[local_2c + -1].include;
      }
      if ((*(int *)(lVar11 + 0x1a8) == 0) || ((*in_RSI == 0 && ((*in_RSI != 0 || (in_ECX != 1))))))
      {
        *(undefined4 *)(lVar11 + (long)local_2c * 0x94 + 0x1f8) = 0;
        *(int *)(lVar11 + (long)local_2c * 0x94 + 0x208) = in_RDI[4];
        *(undefined4 *)(lVar11 + (long)local_2c * 0x94 + 500) = 0;
        *(int *)(lVar11 + (long)local_2c * 0x94 + 0x204) = local_38;
        *(undefined4 *)(lVar11 + (long)local_2c * 0x94 + 0x1f0) = 0;
        *(undefined4 *)(lVar11 + (long)local_2c * 0x94 + 0x200) = *(undefined4 *)(lVar11 + 0xc);
        *(undefined4 *)(lVar11 + (long)local_2c * 0x94 + 0x1d0) = *(undefined4 *)(lVar11 + 8);
      }
      else {
        *(undefined4 *)(lVar11 + (long)local_2c * 0x94 + 0x1f8) =
             *(undefined4 *)(lVar11 + (long)local_2c * 0x94 + 0x1b0);
        *(undefined4 *)(lVar11 + (long)local_2c * 0x94 + 0x208) =
             *(undefined4 *)(lVar11 + (long)local_2c * 0x94 + 0x1bc);
        *(undefined4 *)(lVar11 + (long)local_2c * 0x94 + 500) =
             *(undefined4 *)(lVar11 + 0x1ac + (long)local_2c * 0x94);
        *(undefined4 *)(lVar11 + (long)local_2c * 0x94 + 0x204) =
             *(undefined4 *)(lVar11 + (long)local_2c * 0x94 + 0x1b8);
        *(undefined4 *)(lVar11 + (long)local_2c * 0x94 + 0x200) =
             *(undefined4 *)(lVar11 + (long)local_2c * 0x94 + 0x1b4);
        *(undefined4 *)(lVar11 + (long)local_2c * 0x94 + 0x1d0) =
             *(undefined4 *)(lVar11 + (long)local_2c * 0x94 + 0x1cc);
        if (0 < local_2c) {
          if (*(int *)(lVar11 + (long)(local_2c + -1) * 0x94 + 0x200) <
              *(int *)(lVar11 + (long)local_2c * 0x94 + 0x200)) {
            local_cc = *(undefined4 *)(lVar11 + (long)(local_2c + -1) * 0x94 + 0x200);
          }
          else {
            local_cc = 0;
          }
          *(undefined4 *)(lVar11 + (long)local_2c * 0x94 + 0x1f0) = local_cc;
        }
      }
      *(undefined4 *)(lVar11 + (long)local_2c * 0x94 + 0x1fc) = 0;
      *(int *)(lVar11 + (long)local_2c * 0x94 + 0x20c) = local_3c;
      *(int *)(lVar11 + (long)local_2c * 0x94 + 0x210) = local_8[local_2c].tx0;
      *(int *)(lVar11 + (long)local_2c * 0x94 + 0x214) = local_8[local_2c].tx1;
      *(int *)(lVar11 + (long)local_2c * 0x94 + 0x218) = local_8[local_2c].ty0;
      *(int *)(lVar11 + (long)local_2c * 0x94 + 0x21c) = local_8[local_2c].ty1;
      *(int *)(lVar11 + (long)local_2c * 0x94 + 0x220) = local_8[local_2c].dx;
      *(int *)(lVar11 + (long)local_2c * 0x94 + 0x224) = local_8[local_2c].dy;
    }
  }
  return local_8;
}

Assistant:

opj_pi_iterator_t *pi_initialise_encode(opj_image_t *image, opj_cp_t *cp, int tileno, J2K_T2_MODE t2_mode){ 
	int p, q, pino;
	int compno, resno;
	int maxres = 0;
	int maxprec = 0;
	opj_pi_iterator_t *pi = NULL;
	opj_tcp_t *tcp = NULL;
	opj_tccp_t *tccp = NULL;
	
	tcp = &cp->tcps[tileno];

	pi = (opj_pi_iterator_t*) opj_calloc((tcp->numpocs + 1), sizeof(opj_pi_iterator_t));
	if(!pi) {	return NULL;}
	pi->tp_on = cp->tp_on;

	for(pino = 0;pino < tcp->numpocs+1 ; pino ++){
		p = tileno % cp->tw;
		q = tileno / cp->tw;

		pi[pino].tx0 = int_max(cp->tx0 + p * cp->tdx, image->x0);
		pi[pino].ty0 = int_max(cp->ty0 + q * cp->tdy, image->y0);
		pi[pino].tx1 = int_min(cp->tx0 + (p + 1) * cp->tdx, image->x1);
		pi[pino].ty1 = int_min(cp->ty0 + (q + 1) * cp->tdy, image->y1);
		pi[pino].numcomps = image->numcomps;
		
		pi[pino].comps = (opj_pi_comp_t*) opj_calloc(image->numcomps, sizeof(opj_pi_comp_t));
		if(!pi[pino].comps) {
			pi_destroy(pi, cp, tileno);
			return NULL;
		}
		
		for (compno = 0; compno < pi[pino].numcomps; compno++) {
			int tcx0, tcy0, tcx1, tcy1;
			opj_pi_comp_t *comp = &pi[pino].comps[compno];
			tccp = &tcp->tccps[compno];
			comp->dx = image->comps[compno].dx;
			comp->dy = image->comps[compno].dy;
			comp->numresolutions = tccp->numresolutions;

			comp->resolutions = (opj_pi_resolution_t*) opj_malloc(comp->numresolutions * sizeof(opj_pi_resolution_t));
			if(!comp->resolutions) {
				pi_destroy(pi, cp, tileno);
				return NULL;
			}

			tcx0 = int_ceildiv(pi[pino].tx0, comp->dx);
			tcy0 = int_ceildiv(pi[pino].ty0, comp->dy);
			tcx1 = int_ceildiv(pi[pino].tx1, comp->dx);
			tcy1 = int_ceildiv(pi[pino].ty1, comp->dy);
			if (comp->numresolutions > maxres) {
				maxres = comp->numresolutions;
			}

			for (resno = 0; resno < comp->numresolutions; resno++) {
				int levelno;
				int rx0, ry0, rx1, ry1;
				int px0, py0, px1, py1;
				opj_pi_resolution_t *res = &comp->resolutions[resno];
				if (tccp->csty & J2K_CCP_CSTY_PRT) {
					res->pdx = tccp->prcw[resno];
					res->pdy = tccp->prch[resno];
				} else {
					res->pdx = 15;
					res->pdy = 15;
				}
				levelno = comp->numresolutions - 1 - resno;
				rx0 = int_ceildivpow2(tcx0, levelno);
				ry0 = int_ceildivpow2(tcy0, levelno);
				rx1 = int_ceildivpow2(tcx1, levelno);
				ry1 = int_ceildivpow2(tcy1, levelno);
				px0 = int_floordivpow2(rx0, res->pdx) << res->pdx;
				py0 = int_floordivpow2(ry0, res->pdy) << res->pdy;
				px1 = int_ceildivpow2(rx1, res->pdx) << res->pdx;
				py1 = int_ceildivpow2(ry1, res->pdy) << res->pdy;
				res->pw = (rx0==rx1)?0:((px1 - px0) >> res->pdx);
				res->ph = (ry0==ry1)?0:((py1 - py0) >> res->pdy);

				if (res->pw*res->ph > maxprec) {
					maxprec = res->pw * res->ph;
				}
			}
		}
		
		tccp = &tcp->tccps[0];
		pi[pino].step_p = 1;
		pi[pino].step_c = maxprec * pi[pino].step_p;
		pi[pino].step_r = image->numcomps * pi[pino].step_c;
		pi[pino].step_l = maxres * pi[pino].step_r;
		
		for (compno = 0; compno < pi->numcomps; compno++) {
			opj_pi_comp_t *comp = &pi->comps[compno];
			for (resno = 0; resno < comp->numresolutions; resno++) {
				int dx, dy;
				opj_pi_resolution_t *res = &comp->resolutions[resno];
				dx = comp->dx * (1 << (res->pdx + comp->numresolutions - 1 - resno));
				dy = comp->dy * (1 << (res->pdy + comp->numresolutions - 1 - resno));
				pi[pino].dx = !pi->dx ? dx : int_min(pi->dx, dx);
				pi[pino].dy = !pi->dy ? dy : int_min(pi->dy, dy);
			}
		}

		if (pino == 0) {
			pi[pino].include = (short int*) opj_calloc(tcp->numlayers * pi[pino].step_l, sizeof(short int));
			if(!pi[pino].include) {
				pi_destroy(pi, cp, tileno);
				return NULL;
			}
		}
		else {
			pi[pino].include = pi[pino - 1].include;
		}
		
		/* Generation of boundaries for each prog flag*/
			if(tcp->POC && ( cp->cinema || ((!cp->cinema) && (t2_mode == FINAL_PASS)))){
				tcp->pocs[pino].compS= tcp->pocs[pino].compno0;
				tcp->pocs[pino].compE= tcp->pocs[pino].compno1;
				tcp->pocs[pino].resS = tcp->pocs[pino].resno0;
				tcp->pocs[pino].resE = tcp->pocs[pino].resno1;
				tcp->pocs[pino].layE = tcp->pocs[pino].layno1;
				tcp->pocs[pino].prg  = tcp->pocs[pino].prg1;
				if (pino > 0)
					tcp->pocs[pino].layS = (tcp->pocs[pino].layE > tcp->pocs[pino - 1].layE) ? tcp->pocs[pino - 1].layE : 0;
			}else {
				tcp->pocs[pino].compS= 0;
				tcp->pocs[pino].compE= image->numcomps;
				tcp->pocs[pino].resS = 0;
				tcp->pocs[pino].resE = maxres;
				tcp->pocs[pino].layS = 0;
				tcp->pocs[pino].layE = tcp->numlayers;
				tcp->pocs[pino].prg  = tcp->prg;
			}
			tcp->pocs[pino].prcS = 0;
			tcp->pocs[pino].prcE = maxprec;;
			tcp->pocs[pino].txS = pi[pino].tx0;
			tcp->pocs[pino].txE = pi[pino].tx1;
			tcp->pocs[pino].tyS = pi[pino].ty0;
			tcp->pocs[pino].tyE = pi[pino].ty1;
			tcp->pocs[pino].dx = pi[pino].dx;
			tcp->pocs[pino].dy = pi[pino].dy;
		}
			return pi;
	}